

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O3

aiQuaternion __thiscall
Assimp::FBX::FBXConverter::EulerToQuaternion(FBXConverter *this,aiVector3D *rot,RotOrder order)

{
  undefined1 auVar1 [16];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  float fVar14;
  aiQuaternion aVar15;
  aiMatrix4x4 m;
  aiMatrix4x4 local_48;
  
  local_48.a1 = 1.0;
  local_48.a2 = 0.0;
  local_48.a3 = 0.0;
  local_48.a4 = 0.0;
  local_48.b1 = 0.0;
  local_48.b2 = 1.0;
  local_48.b3 = 0.0;
  local_48.b4 = 0.0;
  local_48.c1 = 0.0;
  local_48.c2 = 0.0;
  local_48.c3 = 1.0;
  local_48.c4 = 0.0;
  local_48.d1 = 0.0;
  local_48.d2 = 0.0;
  local_48.d3 = 0.0;
  local_48.d4 = 1.0;
  GetRotationMatrix(this,order,rot,&local_48);
  fVar2 = local_48.a2;
  fVar3 = local_48.a3;
  fVar4 = local_48.b1;
  fVar5 = local_48.b3;
  fVar6 = local_48.c1;
  fVar7 = local_48.c2;
  fVar12 = local_48.a1 + local_48.b2 + local_48.c3;
  if (fVar12 <= 0.0) {
    if ((local_48.a1 <= local_48.b2) || (local_48.a1 <= local_48.c3)) {
      if (local_48.b2 <= local_48.c3) {
        fVar11 = ((local_48.c3 + 1.0) - local_48.a1) - local_48.b2;
        if (fVar11 < 0.0) {
          fVar11 = sqrtf(fVar11);
        }
        else {
          fVar11 = SQRT(fVar11);
        }
        fVar11 = fVar11 + fVar11;
        fVar14 = (fVar3 + fVar6) / fVar11;
        fVar12 = (fVar4 - fVar2) / fVar11;
        uVar8 = CONCAT44(fVar11 * 0.25,(fVar5 + fVar7) / fVar11);
      }
      else {
        fVar12 = ((local_48.b2 + 1.0) - local_48.a1) - local_48.c3;
        if (fVar12 < 0.0) {
          fVar12 = sqrtf(fVar12);
        }
        else {
          fVar12 = SQRT(fVar12);
        }
        fVar12 = fVar12 + fVar12;
        fVar14 = (fVar4 + fVar2) / fVar12;
        uVar8 = CONCAT44((fVar5 + fVar7) / fVar12,fVar12 * 0.25);
        fVar12 = (fVar3 - fVar6) / fVar12;
      }
    }
    else {
      fVar12 = ((local_48.a1 + 1.0) - local_48.b2) - local_48.c3;
      if (fVar12 < 0.0) {
        fVar12 = sqrtf(fVar12);
      }
      else {
        fVar12 = SQRT(fVar12);
      }
      fVar12 = fVar12 + fVar12;
      fVar14 = fVar12 * 0.25;
      auVar13._0_4_ = fVar2 + fVar4;
      auVar13._4_4_ = fVar3 + fVar6;
      auVar13._8_8_ = 0;
      auVar10._4_4_ = fVar12;
      auVar10._0_4_ = fVar12;
      auVar10._8_4_ = fVar12;
      auVar10._12_4_ = fVar12;
      auVar10 = divps(auVar13,auVar10);
      fVar12 = (fVar7 - fVar5) / fVar12;
      uVar8 = auVar10._0_8_;
    }
  }
  else {
    fVar12 = fVar12 + 1.0;
    if (fVar12 < 0.0) {
      fVar12 = sqrtf(fVar12);
    }
    else {
      fVar12 = SQRT(fVar12);
    }
    fVar12 = fVar12 + fVar12;
    fVar14 = (fVar7 - fVar5) / fVar12;
    auVar9._0_4_ = fVar3 - fVar6;
    auVar9._4_4_ = fVar4 - fVar2;
    auVar9._8_4_ = fVar3 - 0.0;
    auVar9._12_4_ = fVar3 - fVar3;
    auVar1._4_4_ = fVar12;
    auVar1._0_4_ = fVar12;
    auVar1._8_4_ = fVar12;
    auVar1._12_4_ = fVar12;
    auVar10 = divps(auVar9,auVar1);
    uVar8 = auVar10._0_8_;
    fVar12 = fVar12 * 0.25;
  }
  aVar15.x = fVar14;
  aVar15.w = fVar12;
  aVar15.y = (float)(int)uVar8;
  aVar15.z = (float)(int)((ulong)uVar8 >> 0x20);
  return aVar15;
}

Assistant:

aiQuaternion FBXConverter::EulerToQuaternion(const aiVector3D& rot, Model::RotOrder order)
        {
            aiMatrix4x4 m;
            GetRotationMatrix(order, rot, m);

            return aiQuaternion(aiMatrix3x3(m));
        }